

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O3

void generate<trng::count128_lcg_shift>(size_t samples,unsigned_long seed)

{
  parameter_type P;
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  bool bVar3;
  count128_lcg_shift r;
  char local_59;
  count128_lcg_shift local_58;
  
  P.increment.value._8_8_ = trng::count128_lcg_shift::Default._8_8_;
  P.increment.value._0_8_ = trng::count128_lcg_shift::Default._0_8_;
  P.a = trng::count128_lcg_shift::Default._16_8_;
  P.b = trng::count128_lcg_shift::Default._24_8_;
  trng::count128_lcg_shift::count128_lcg_shift(&local_58,P);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::count128_lcg_shift::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3500d0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"count: ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"numbit: ",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  if (samples != 0) {
    do {
      bVar3 = CARRY8((ulong)local_58.P.increment.value,(ulong)local_58.S.r.value);
      local_58.S.r.value._0_8_ = (ulong)local_58.P.increment.value + (ulong)local_58.S.r.value;
      local_58.S.r.value._8_8_ =
           local_58.P.increment.value._8_8_ + local_58.S.r.value._8_8_ + (ulong)bVar3;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_59 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
      samples = samples - 1;
    } while (samples != 0);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}